

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t
ctrl_set_skip_postproc_filtering(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  av1_extracfg *in_RSI;
  long in_RDI;
  av1_extracfg extra_cfg;
  undefined4 *local_288;
  undefined4 in_stack_fffffffffffffd88;
  undefined1 local_270 [560];
  undefined4 local_40;
  av1_extracfg *local_18;
  aom_codec_err_t local_4;
  
  if (*(int *)(in_RDI + 0xd0) == 2) {
    local_18 = in_RSI;
    memcpy(local_270,(void *)(in_RDI + 0x458),600);
    uVar1 = local_18->cpu_used;
    if (uVar1 < 0x29) {
      local_288 = (undefined4 *)((long)(int)uVar1 + *(long *)&local_18->sharpness);
      local_18->cpu_used = uVar1 + 8;
    }
    else {
      local_288 = *(undefined4 **)&local_18->enable_auto_bwd_ref;
      *(undefined4 **)&local_18->enable_auto_bwd_ref = local_288 + 2;
    }
    local_40 = *local_288;
    local_4 = update_extra_cfg((aom_codec_alg_priv_t_conflict *)
                               CONCAT44(uVar1,in_stack_fffffffffffffd88),local_18);
  }
  else {
    local_4 = AOM_CODEC_INCAPABLE;
  }
  return local_4;
}

Assistant:

static aom_codec_err_t ctrl_set_skip_postproc_filtering(
    aom_codec_alg_priv_t *ctx, va_list args) {
  // Skipping the application of post-processing filters is allowed only
  // for ALLINTRA mode.
  if (ctx->cfg.g_usage != AOM_USAGE_ALL_INTRA) return AOM_CODEC_INCAPABLE;
  struct av1_extracfg extra_cfg = ctx->extra_cfg;
  extra_cfg.skip_postproc_filtering =
      CAST(AV1E_SET_SKIP_POSTPROC_FILTERING, args);
  return update_extra_cfg(ctx, &extra_cfg);
}